

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

int32_t helicsDataBufferFillFromNamedPoint(HelicsDataBuffer data,char *name,double val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Message *pMVar2;
  size_t sVar3;
  int32_t iVar4;
  _Alloc_hider _Var5;
  NamedPoint local_48;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar2 = getMessageObj(data,(HelicsError *)0x0);
    data = &pMVar2->data;
    if (pMVar2 == (Message *)0x0) {
      data = (SmallBuffer *)0x0;
    }
  }
  iVar4 = 0;
  if ((SmallBuffer *)data != (SmallBuffer *)0x0) {
    sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (name != (char *)0x0) {
      sVar3 = strlen(name);
      _Var5._M_p = name;
    }
    paVar1 = &local_48.name.field_2;
    local_48.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,_Var5._M_p,_Var5._M_p + sVar3);
    local_48.value = val;
    helics::SmallBuffer::reserve((SmallBuffer *)data,local_48.name._M_string_length + 0x10);
    ((SmallBuffer *)data)->bufferSize = local_48.name._M_string_length + 0x10;
    helics::detail::convertToBinary(((SmallBuffer *)data)->heap,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.name._M_dataplus._M_p,local_48.name.field_2._M_allocated_capacity + 1
                     );
    }
    iVar4 = (int32_t)((SmallBuffer *)data)->bufferSize;
  }
  return iVar4;
}

Assistant:

int32_t helicsDataBufferFillFromNamedPoint(HelicsDataBuffer data, const char* name, double val)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<helics::NamedPoint>::convert(helics::NamedPoint(AS_STRING_VIEW(name), val), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}